

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

int xmlStreamCompAddStep(xmlStreamCompPtr comp,xmlChar *name,xmlChar *ns,int nodeType,int flags)

{
  int iVar1;
  uint uVar2;
  xmlStreamStepPtr pxVar3;
  uint uVar4;
  uint uVar5;
  
  iVar1 = comp->nbStep;
  uVar2 = comp->maxStep;
  if (iVar1 < (int)uVar2) {
    pxVar3 = comp->steps;
  }
  else {
    if ((int)uVar2 < 1) {
      uVar5 = 4;
    }
    else {
      if (999999999 < uVar2) {
        return -1;
      }
      uVar4 = uVar2 + 1 >> 1;
      uVar5 = uVar4 + uVar2;
      if (1000000000 - uVar4 < uVar2) {
        uVar5 = 1000000000;
      }
    }
    pxVar3 = (xmlStreamStepPtr)(*xmlRealloc)(comp->steps,(ulong)uVar5 << 5);
    if (pxVar3 == (xmlStreamStepPtr)0x0) {
      return -1;
    }
    comp->steps = pxVar3;
    comp->maxStep = uVar5;
    iVar1 = comp->nbStep;
  }
  comp->nbStep = iVar1 + 1;
  pxVar3[iVar1].flags = flags;
  pxVar3[iVar1].name = name;
  pxVar3[iVar1].ns = ns;
  pxVar3[iVar1].nodeType = nodeType;
  return iVar1;
}

Assistant:

static int
xmlStreamCompAddStep(xmlStreamCompPtr comp, const xmlChar *name,
                     const xmlChar *ns, int nodeType, int flags) {
    xmlStreamStepPtr cur;

    if (comp->nbStep >= comp->maxStep) {
        xmlStreamStepPtr tmp;
        int newSize;

        newSize = xmlGrowCapacity(comp->maxStep, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamComp: growCapacity failed\n");
	    return(-1);
        }
	cur = xmlRealloc(comp->steps, newSize * sizeof(tmp[0]));
	if (cur == NULL) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamComp: malloc failed\n");
	    return(-1);
	}
	comp->steps = cur;
        comp->maxStep = newSize;
    }
    cur = &comp->steps[comp->nbStep++];
    cur->flags = flags;
    cur->name = name;
    cur->ns = ns;
    cur->nodeType = nodeType;
    return(comp->nbStep - 1);
}